

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamGenerator<unsigned_int_(*)(const_short_*)> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator
          (ValueArray<unsigned_int_(*)(const_short_*)> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 in_RSI;
  element_type *in_RDI;
  ParamGenerator<unsigned_int_(*)(const_short_*)> PVar1;
  vector<unsigned_int_(*)(const_short_*),_std::allocator<unsigned_int_(*)(const_short_*)>_>
  *in_stack_ffffffffffffffc0;
  vector<unsigned_int_(*)(const_short_*),_std::allocator<unsigned_int_(*)(const_short_*)>_>
  *in_stack_ffffffffffffffc8;
  ValueArray<unsigned_int_(*)(const_short_*)> local_28 [5];
  
  ValueArray<unsigned_int(*)(short_const*)>::MakeVector<unsigned_int(*)(short_const*),0ul>
            (local_28,in_RSI);
  ValuesIn<std::vector<unsigned_int(*)(short_const*),std::allocator<unsigned_int(*)(short_const*)>>>
            (in_stack_ffffffffffffffc8);
  std::vector<unsigned_int_(*)(const_short_*),_std::allocator<unsigned_int_(*)(const_short_*)>_>::
  ~vector(in_stack_ffffffffffffffc0);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int_(*)(const_short_*)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int_(*)(const_short_*)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = in_RDI;
  return (ParamGenerator<unsigned_int_(*)(const_short_*)>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_int_(*)(const_short_*)>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }